

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnLoopExpr(BinaryReaderInterp *this,Type sig_type)

{
  Result RVar1;
  Offset offset;
  
  RVar1 = SharedValidator::OnLoop
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     sig_type);
  if (RVar1.enum_ != Error) {
    offset = Istream::end(this->istream_);
    PushLabel(this,offset,0xffffffff);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnLoopExpr(Type sig_type) {
  CHECK_RESULT(validator_.OnLoop(loc, sig_type));
  PushLabel(istream_.end());
  return Result::Ok;
}